

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::FormulasLoader::begin__formula
          (FormulasLoader *this,formula__AttributeData *attributeData)

{
  Formula *pFVar1;
  ParserChar *colladaId;
  allocator<char> local_39;
  UniqueId local_38;
  
  pFVar1 = (Formula *)operator_new(0xa8);
  IFilePartLoader::createUniqueIdFromId
            (&local_38,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             attributeData->id,FORMULA);
  COLLADAFW::Formula::Formula(pFVar1,&local_38);
  this->mCurrentFormula = pFVar1;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id == (char *)0x0) {
      if (attributeData->sid == (char *)0x0) goto LAB_00797bb3;
      pFVar1 = this->mCurrentFormula;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->sid,&local_39);
      std::__cxx11::string::_M_assign((string *)&pFVar1->mName);
    }
    else {
      pFVar1 = this->mCurrentFormula;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pFVar1->mName);
    }
  }
  else {
    pFVar1 = this->mCurrentFormula;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pFVar1->mName);
  }
  if (local_38._0_8_ != (long)&local_38 + 0x10U) {
    operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
  }
LAB_00797bb3:
  if (attributeData->id == (char *)0x0) {
    colladaId = (char *)0x0;
  }
  else {
    pFVar1 = this->mCurrentFormula;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->id,&local_39);
    std::__cxx11::string::_M_assign((string *)&pFVar1->mOriginalId);
    if (local_38._0_8_ != (long)&local_38 + 0x10U) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
    colladaId = attributeData->id;
  }
  IFilePartLoader::addToSidTree
            (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             colladaId,attributeData->sid,(Object *)this->mCurrentFormula);
  return true;
}

Assistant:

bool FormulasLoader::begin__formula( const formula__AttributeData& attributeData )
	{
		mCurrentFormula = FW_NEW COLLADAFW::Formula( getHandlingFilePartLoader()->createUniqueIdFromId( attributeData.id, COLLADAFW::Formula::ID()) );
		if ( attributeData.name )
			mCurrentFormula->setName( attributeData.name );
		else if ( attributeData.id )
			mCurrentFormula->setName( attributeData.id );
		else if ( attributeData.sid )
			mCurrentFormula->setName( attributeData.sid );

		if ( attributeData.id )
			mCurrentFormula->setOriginalId ( attributeData.id );

		getHandlingFilePartLoader()->addToSidTree( attributeData.id, attributeData.sid, mCurrentFormula );

		return true;
	}